

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O3

void Omega_h::add_implied_metric_tag(Mesh *mesh)

{
  int *piVar1;
  Alloc *this;
  Reals metrics;
  Reals local_58;
  Alloc *local_48;
  void *local_40;
  string local_38;
  
  get_implied_metrics((Omega_h *)&local_48,mesh);
  local_58.write_.shared_alloc_.alloc = local_48;
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
    }
    else {
      local_48->use_count = local_48->use_count + 1;
    }
  }
  this = local_58.write_.shared_alloc_.alloc;
  local_58.write_.shared_alloc_.direct_ptr = local_40;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"metric","");
  add_metric_tag(mesh,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    piVar1 = &local_48->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48);
      operator_delete(local_48,0x48);
    }
  }
  return;
}

Assistant:

void add_implied_metric_tag(Mesh* mesh) {
  auto metrics = get_implied_metrics(mesh);
  add_metric_tag(mesh, metrics, "metric");
}